

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O0

fs * __thiscall util::fs::join_path(fs *this,string *path1,string *path2)

{
  bool bVar1;
  fs local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [36];
  undefined4 local_44;
  fs local_40 [8];
  string p2;
  string *path2_local;
  string *path1_local;
  
  sanitize_path(local_40,path2);
  bVar1 = is_absolute((string *)local_40);
  if (bVar1) {
    std::__cxx11::string::string((string *)this,(string *)local_40);
  }
  else {
    sanitize_path(local_88,path1);
    std::operator+(local_68,(char)local_88);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   local_68);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)local_88);
  }
  local_44 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return this;
}

Assistant:

std::string
join_path (std::string const& path1, std::string const& path2)
{
    std::string p2 = sanitize_path(path2);
    if (is_absolute(p2))
        return p2;

#ifdef _WIN32
    if (!p2.empty() && p2[0] == '/')
        return sanitize_path(path1) + p2;
#endif

    return sanitize_path(path1) + '/' + p2;
}